

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void __thiscall
OpenMesh::IO::_PLYReader_::readCustomProperty
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName,
          ValueType _valueType)

{
  ostream *this_00;
  ValueType _valueType_local;
  string *_propName_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _PLYReader_ *this_local;
  VertexHandle _vh_local;
  
  switch(_valueType) {
  case ValueTypeINT8:
  case ValueTypeCHAR:
    assignCustomProperty<char>(_in,_bi,_vh,_propName);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"unsupported type");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    break;
  case ValueTypeINT16:
  case ValueTypeSHORT:
    assignCustomProperty<short>(_in,_bi,_vh,_propName);
    break;
  case ValueTypeUINT16:
  case ValueTypeUSHORT:
    assignCustomProperty<unsigned_short>(_in,_bi,_vh,_propName);
    break;
  case ValueTypeINT32:
  case ValueTypeINT:
    assignCustomProperty<int>(_in,_bi,_vh,_propName);
    break;
  case ValueTypeUINT32:
  case ValueTypeUINT:
    assignCustomProperty<unsigned_int>(_in,_bi,_vh,_propName);
    break;
  case ValueTypeFLOAT32:
  case ValueTypeFLOAT:
    assignCustomProperty<float>(_in,_bi,_vh,_propName);
    break;
  case ValueTypeFLOAT64:
  case ValueTypeDOUBLE:
    assignCustomProperty<double>(_in,_bi,_vh,_propName);
  }
  return;
}

Assistant:

void _PLYReader_::readCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName, const ValueType _valueType) const
{
  switch (_valueType)
  {
  case ValueTypeINT8:
  case ValueTypeCHAR:
      assignCustomProperty<char>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeINT16:
  case ValueTypeSHORT:
      assignCustomProperty<short>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeUINT16:
  case ValueTypeUSHORT:
      assignCustomProperty<unsigned short>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeINT32:
  case ValueTypeINT:
      assignCustomProperty<int>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeUINT32:
  case ValueTypeUINT:
      assignCustomProperty<unsigned int>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeFLOAT32:
  case ValueTypeFLOAT:
      assignCustomProperty<float>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeFLOAT64:
  case ValueTypeDOUBLE:
      assignCustomProperty<double>(_in,_bi,_vh,_propName);
      break;
  default:
      std::cerr << "unsupported type" << std::endl;
      break;
  }
}